

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::WriteEncoderPreload(AmpIO *this,uint index,int32_t sdata)

{
  BasePort *pBVar1;
  int iVar2;
  long *plVar3;
  
  if (sdata - 0x800000U < 0xff000000) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AmpIO::WriteEncoderPreload, preload out of range ",0x31);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,sdata);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    if ((pBVar1 != (BasePort *)0x0) && (index < this->NumEncoders)) {
      iVar2 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)(index * 0x10 + 0x14),(ulong)(sdata + 0x800000));
      return SUB41(iVar2,0);
    }
  }
  return false;
}

Assistant:

bool AmpIO::WriteEncoderPreload(unsigned int index, int32_t sdata)
{
    unsigned int channel = (index+1) << 4;

    if ((sdata >= ENC_MIDRANGE) || (sdata < -ENC_MIDRANGE)) {
        std::cerr << "AmpIO::WriteEncoderPreload, preload out of range " << sdata << std::endl;
        return false;
    }
    bool ret = false;
    if (port && (index < NumEncoders)) {
        ret = port->WriteQuadlet(BoardId, channel | ENC_LOAD_REG,
                                 static_cast<uint32_t>(sdata + ENC_MIDRANGE));
    }
    return ret;
}